

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O1

int32 TTD::LookupPositionInDictNameList<Js::DebuggerScope*,true>
                (char16 *key,
                BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *objToNameMap,
                List<Js::DebuggerScope_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *sortedObjList,TTAutoString *nullString)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DebuggerScope **ppDVar5;
  TTAutoString *pTVar6;
  char16 *pcVar7;
  int index;
  int index_00;
  int iVar8;
  
  if ((sortedObjList->
      super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>).count == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTRuntimeInfoTracker.h"
                       ,0x142,"(sortedObjList.Count() != 0)",
                       "We are using this for matching so obviously no match and there is a problem."
                      );
    if (!bVar2) {
LAB_00908efc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar8 = (sortedObjList->
          super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>).count +
          -1;
  index_00 = 0;
  if (0 < iVar8) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      index = (iVar8 + index_00) / 2;
      ppDVar5 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&sortedObjList->
                      super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,index);
      pTVar6 = JsUtil::
               BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(objToNameMap,ppDVar5);
      if (iVar8 <= index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTRuntimeInfoTracker.h"
                           ,0x14b,"(imid < imax)","Something went wrong with our indexing.");
        if (!bVar2) goto LAB_00908efc;
        *puVar4 = 0;
      }
      pcVar7 = UtilSupport::TTAutoString::GetStrValue(pTVar6);
      iVar3 = PAL_wcscmp(pcVar7,key);
      if (iVar3 < 0) {
        index_00 = index + 1;
        index = iVar8;
      }
      iVar8 = index;
    } while (index_00 < iVar8);
  }
  if (index_00 != iVar8) {
    TTDAbort_unrecoverable_error("Something went wrong!!!");
  }
  ppDVar5 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>::Item
                      (&sortedObjList->
                        super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>
                       ,index_00);
  pTVar6 = JsUtil::
           BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(objToNameMap,ppDVar5);
  pcVar7 = UtilSupport::TTAutoString::GetStrValue(pTVar6);
  iVar8 = PAL_wcscmp(pcVar7,key);
  if (iVar8 != 0) {
    TTDAbort_unrecoverable_error("We are missing something");
  }
  return index_00;
}

Assistant:

int32 LookupPositionInDictNameList(const char16* key, const JsUtil::BaseDictionary<T, UtilSupport::TTAutoString*, HeapAllocator>& objToNameMap, const JsUtil::List<T, HeapAllocator>& sortedObjList, const UtilSupport::TTAutoString& nullString)
    {
        AssertMsg(sortedObjList.Count() != 0, "We are using this for matching so obviously no match and there is a problem.");

        int32 imin = 0;
        int32 imax = sortedObjList.Count() - 1;

        while(imin < imax)
        {
            int imid = (imin + imax) / 2;
            const UtilSupport::TTAutoString* imidStr = objToNameMap.Item(sortedObjList.Item(imid));
            AssertMsg(imid < imax, "Something went wrong with our indexing.");

            int32 scmpval = wcscmp(imidStr->GetStrValue(), key);
            if(scmpval < 0)
            {
                imin = imid + 1;
            }
            else
            {
                imax = imid;
            }

        }
        TTDAssert(imin == imax, "Something went wrong!!!");
        
        const UtilSupport::TTAutoString* resStr = objToNameMap.Item(sortedObjList.Item(imin));
        if(mustFind)
        {
            TTDAssert(wcscmp(resStr->GetStrValue(), key) == 0, "We are missing something");
            return imin;
        }
        else
        {
            return (wcscmp(resStr->GetStrValue(), key) == 0) ? imin : -1;
        }
    }